

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

string * __thiscall
JetHead::Path::fileBasename_abi_cxx11_(string *__return_storage_ptr__,Path *this)

{
  string f;
  
  filename_abi_cxx11_(&f,this);
  std::__cxx11::string::rfind((char *)&f,0x123b3f);
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&f);
  std::__cxx11::string::~string((string *)&f);
  return __return_storage_ptr__;
}

Assistant:

string Path::fileBasename()
{
	string f = filename();
	unsigned pos = f.rfind( "." );

	if ( pos == string::npos )
	{
		return f;
	}
	else
	{
		return f.substr( 0, pos );
	}
}